

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O0

void __thiscall optimization::inlineFunc::Rewriter::cast_block(Rewriter *this,BasicBlk *blk)

{
  bool bVar1;
  mapped_type *pmVar2;
  reference piVar3;
  pointer pIVar4;
  Timestamp *pTVar5;
  size_type sVar6;
  VarId *pVVar7;
  int __c;
  long in_RSI;
  char *pcVar8;
  long in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<int,_BasicBlk>_>::value,_pair<iterator,_bool>_>
  _Var9;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar10;
  int bb_false;
  int bb_true;
  optional<mir::inst::VarId> cond_or_ret;
  VarId vaR;
  iterator __end5_1;
  iterator __begin5_1;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *__range5_1;
  vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> vars;
  PhiInst *phiInst;
  PtrOffsetInst *ptrInst;
  Value val_1;
  iterator __end5;
  iterator __begin5;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *__range5;
  vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> paras;
  CallInst *callInst;
  StoreInst *storeInst;
  LoadInst *loadInst;
  AssignInst *assignInst;
  OpInst *opInst;
  variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _val;
  variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  val;
  RefInst *refInst;
  Inst *i;
  InstKind kind;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  iterator __end2_1;
  iterator __begin2_1;
  vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  *__range2_1;
  mapped_type new_pre;
  int pre;
  iterator __end2;
  iterator __begin2;
  set<int,_std::less<int>,_std::allocator<int>_> *__range2;
  mapped_type *new_blk;
  mapped_type new_id;
  undefined4 in_stack_fffffffffffff538;
  uint32_t in_stack_fffffffffffff53c;
  undefined4 in_stack_fffffffffffff540;
  undefined4 in_stack_fffffffffffff544;
  JumpKind jump_kind;
  undefined4 in_stack_fffffffffffff548;
  mapped_type mVar11;
  undefined4 in_stack_fffffffffffff54c;
  mapped_type mVar12;
  Function *in_stack_fffffffffffff550;
  int bb_false_00;
  Rewriter *in_stack_fffffffffffff558;
  JumpInstruction *in_stack_fffffffffffff560;
  Function *in_stack_fffffffffffff568;
  Value *in_stack_fffffffffffff570;
  Rewriter *in_stack_fffffffffffff578;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff588;
  Value *in_stack_fffffffffffff590;
  Value *in_stack_fffffffffffff598;
  BasicBlk *in_stack_fffffffffffff5a0;
  VarId *in_stack_fffffffffffff5a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff5b0;
  Value *in_stack_fffffffffffff5b8;
  Value *in_stack_fffffffffffff5c0;
  Timestamp *in_stack_fffffffffffff5c8;
  ostream *in_stack_fffffffffffff5d0;
  undefined8 local_9e8;
  Severity *in_stack_fffffffffffff638;
  ostream *in_stack_fffffffffffff640;
  undefined8 local_978;
  undefined8 local_930;
  undefined8 local_8e8;
  undefined8 local_890;
  long local_848;
  JumpInstruction local_7f0;
  uint32_t local_7b4;
  mapped_type local_7a0;
  mapped_type local_79c;
  undefined1 local_779 [40];
  undefined1 local_751 [121];
  time_point_sys_clock local_6d8;
  Timestamp local_6d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6b8;
  undefined1 local_681;
  VarId local_680 [2];
  undefined1 local_658 [40];
  undefined1 local_630 [32];
  undefined1 *local_610;
  Value *local_5f0;
  ostream local_588 [48];
  undefined8 local_558;
  Severity local_550 [144];
  Value *local_4c0;
  __normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
  local_4b8;
  ostream *local_4b0;
  ostream *local_490;
  undefined8 local_418;
  undefined8 local_3a0;
  undefined8 local_328;
  undefined8 local_270;
  uint32_t local_234;
  variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  long local_1d0;
  Timestamp *local_1c8;
  int local_1bc;
  reference local_1b8;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *local_1b0;
  __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
  local_1a8;
  long local_1a0;
  _Base_ptr local_198;
  undefined1 local_190;
  int local_188;
  int local_184;
  _Self local_180;
  _Self local_178;
  long local_170;
  mapped_type *local_168;
  _Base_ptr local_160;
  undefined1 local_158;
  mapped_type local_14;
  long local_10;
  
  local_10 = in_RSI;
  pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                     ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                      in_stack_fffffffffffff560,(key_type *)in_stack_fffffffffffff558);
  local_14 = *pmVar2;
  mir::inst::BasicBlk::BasicBlk
            (in_stack_fffffffffffff5a0,(LabelId)((ulong)in_stack_fffffffffffff598 >> 0x20));
  std::make_pair<int&,mir::inst::BasicBlk>
            ((int *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
             (BasicBlk *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
  _Var9 = std::
          map<int,mir::inst::BasicBlk,std::less<int>,std::allocator<std::pair<int_const,mir::inst::BasicBlk>>>
          ::insert<std::pair<int,mir::inst::BasicBlk>>
                    ((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                      *)in_stack_fffffffffffff550,
                     (pair<int,_mir::inst::BasicBlk> *)
                     CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  local_160 = (_Base_ptr)_Var9.first._M_node;
  local_158 = _Var9.second;
  std::pair<int,_mir::inst::BasicBlk>::~pair((pair<int,_mir::inst::BasicBlk> *)0x157bbb);
  mir::inst::BasicBlk::~BasicBlk
            ((BasicBlk *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
  local_168 = std::
              map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              ::at((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                    *)in_stack_fffffffffffff560,(key_type *)in_stack_fffffffffffff558);
  local_170 = local_10 + 0x10;
  local_178._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  local_180._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  while (bVar1 = std::operator!=(&local_178,&local_180), bVar1) {
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*
                       ((_Rb_tree_const_iterator<int> *)
                        CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
    local_184 = *piVar3;
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)in_stack_fffffffffffff560,(key_type *)in_stack_fffffffffffff558);
    local_188 = *pmVar2;
    if (local_188 == *(int *)(in_RDI + 0xb0)) {
      local_188 = *(int *)(in_RDI + 0xa8);
    }
    pVar10 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                       ((set<int,_std::less<int>,_std::allocator<int>_> *)in_stack_fffffffffffff560,
                        (value_type_conflict3 *)in_stack_fffffffffffff558);
    local_198 = (_Base_ptr)pVar10.first._M_node;
    local_190 = pVar10.second;
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)
               CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
  }
  local_1a0 = local_10 + 0x40;
  local_1a8._M_current =
       (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
       std::
       vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
       ::begin((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  local_1b0 = (unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
              std::
              vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              ::end((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                            (__normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538)), bVar1
        ) {
    local_1b8 = __gnu_cxx::
                __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
                ::operator*(&local_1a8);
    pIVar4 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                       ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                        0x157daf);
    local_1bc = (*(pIVar4->super_Displayable)._vptr_Displayable[1])();
    pTVar5 = (Timestamp *)
             std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator*
                       ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                        CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
    local_1c8 = pTVar5;
    switch(local_1bc) {
    case 0:
      if (pTVar5 == (Timestamp *)0x0) {
        local_8e8 = 0;
      }
      else {
        local_8e8 = __dynamic_cast(pTVar5,&mir::inst::Inst::typeinfo,
                                   &mir::inst::AssignInst::typeinfo,0);
      }
      local_328 = local_8e8;
      mir::inst::VarId::VarId
                ((VarId *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (VarId *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_varId(in_stack_fffffffffffff558,(VarId *)in_stack_fffffffffffff550);
      mir::inst::Value::Value
                ((Value *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (Value *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_value(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
      std::make_unique<mir::inst::AssignInst,mir::inst::VarId,mir::inst::Value>
                ((VarId *)in_stack_fffffffffffff598,in_stack_fffffffffffff590);
      std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
      unique_ptr<mir::inst::AssignInst,std::default_delete<mir::inst::AssignInst>,void>
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550,
                 (unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_> *)
                 CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                  (value_type *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550);
      std::unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_>::
      ~unique_ptr((unique_ptr<mir::inst::AssignInst,_std::default_delete<mir::inst::AssignInst>_> *)
                  CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
      break;
    case 1:
      if (pTVar5 == (Timestamp *)0x0) {
        local_890 = 0;
      }
      else {
        local_890 = __dynamic_cast(pTVar5,&mir::inst::Inst::typeinfo,&mir::inst::OpInst::typeinfo,0)
        ;
      }
      local_270 = local_890;
      mir::inst::VarId::VarId
                ((VarId *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (VarId *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_varId(in_stack_fffffffffffff558,(VarId *)in_stack_fffffffffffff550);
      mir::inst::Value::Value
                ((Value *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (Value *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_value(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
      mir::inst::Value::Value
                ((Value *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (Value *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_value(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
      std::
      make_unique<mir::inst::OpInst,mir::inst::VarId,mir::inst::Value,mir::inst::Value,mir::inst::Op&>
                ((VarId *)in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0,
                 in_stack_fffffffffffff5b8,(Op *)in_stack_fffffffffffff5b0);
      std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
      unique_ptr<mir::inst::OpInst,std::default_delete<mir::inst::OpInst>,void>
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550,
                 (unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_> *)
                 CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                  (value_type *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550);
      std::unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_>::~unique_ptr
                ((unique_ptr<mir::inst::OpInst,_std::default_delete<mir::inst::OpInst>_> *)
                 CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
      break;
    case 2:
      if (pTVar5 == (Timestamp *)0x0) {
        local_848 = 0;
      }
      else {
        local_848 = __dynamic_cast(pTVar5,&mir::inst::Inst::typeinfo,&mir::inst::RefInst::typeinfo,0
                                  );
      }
      local_1d0 = local_848;
      pcVar8 = (char *)(local_848 + 0x18);
      std::
      variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::variant((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      std::
      variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::variant((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x157e89);
      pcVar8 = std::
               variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::index(&local_1f8,pcVar8,__c);
      if (pcVar8 == (char *)0x0) {
        pVVar7 = std::get<mir::inst::VarId,mir::inst::VarId,std::__cxx11::string>
                           ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)0x157ec3);
        local_234 = pVVar7->id;
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   in_stack_fffffffffffff560,(key_type *)in_stack_fffffffffffff558);
        mir::inst::VarId::VarId
                  ((VarId *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                   in_stack_fffffffffffff53c);
        std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                  ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff560,(VarId *)in_stack_fffffffffffff558);
      }
      else {
        std::get<std::__cxx11::string,mir::inst::VarId,std::__cxx11::string>
                  ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)0x157f6d);
        std::variant<mir::inst::VarId,std::__cxx11::string>::operator=
                  ((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
      }
      mir::inst::VarId::VarId
                ((VarId *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (VarId *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_varId(in_stack_fffffffffffff558,(VarId *)in_stack_fffffffffffff550);
      std::
      make_unique<mir::inst::RefInst,mir::inst::VarId,std::variant<mir::inst::VarId,std::__cxx11::string>&>
                ((VarId *)in_stack_fffffffffffff598,
                 (variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffff590);
      std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
      unique_ptr<mir::inst::RefInst,std::default_delete<mir::inst::RefInst>,void>
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550,
                 (unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                 CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                  (value_type *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550);
      std::unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_>::~unique_ptr
                ((unique_ptr<mir::inst::RefInst,_std::default_delete<mir::inst::RefInst>_> *)
                 CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
      std::
      variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x15805e);
      std::
      variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~variant((variant<mir::inst::VarId,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x15806b);
      break;
    case 3:
      if (pTVar5 == (Timestamp *)0x0) {
        local_930 = 0;
      }
      else {
        local_930 = __dynamic_cast(pTVar5,&mir::inst::Inst::typeinfo,&mir::inst::LoadInst::typeinfo,
                                   0);
      }
      local_3a0 = local_930;
      mir::inst::Value::Value
                ((Value *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (Value *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_value(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
      mir::inst::VarId::VarId
                ((VarId *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (VarId *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_varId(in_stack_fffffffffffff558,(VarId *)in_stack_fffffffffffff550);
      std::make_unique<mir::inst::LoadInst,mir::inst::Value,mir::inst::VarId>
                (in_stack_fffffffffffff598,(VarId *)in_stack_fffffffffffff590);
      std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
      unique_ptr<mir::inst::LoadInst,std::default_delete<mir::inst::LoadInst>,void>
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550,
                 (unique_ptr<mir::inst::LoadInst,_std::default_delete<mir::inst::LoadInst>_> *)
                 CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                  (value_type *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550);
      std::unique_ptr<mir::inst::LoadInst,_std::default_delete<mir::inst::LoadInst>_>::~unique_ptr
                ((unique_ptr<mir::inst::LoadInst,_std::default_delete<mir::inst::LoadInst>_> *)
                 CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
      break;
    case 4:
      if (pTVar5 == (Timestamp *)0x0) {
        local_978 = 0;
      }
      else {
        local_978 = __dynamic_cast(pTVar5,&mir::inst::Inst::typeinfo,&mir::inst::StoreInst::typeinfo
                                   ,0);
      }
      local_418 = local_978;
      mir::inst::Value::Value
                ((Value *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (Value *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_value(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
      mir::inst::VarId::VarId
                ((VarId *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (VarId *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_varId(in_stack_fffffffffffff558,(VarId *)in_stack_fffffffffffff550);
      std::make_unique<mir::inst::StoreInst,mir::inst::Value,mir::inst::VarId>
                (in_stack_fffffffffffff598,(VarId *)in_stack_fffffffffffff590);
      std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
      unique_ptr<mir::inst::StoreInst,std::default_delete<mir::inst::StoreInst>,void>
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550,
                 (unique_ptr<mir::inst::StoreInst,_std::default_delete<mir::inst::StoreInst>_> *)
                 CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                  (value_type *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550);
      std::unique_ptr<mir::inst::StoreInst,_std::default_delete<mir::inst::StoreInst>_>::~unique_ptr
                ((unique_ptr<mir::inst::StoreInst,_std::default_delete<mir::inst::StoreInst>_> *)
                 CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
      break;
    case 5:
      if (pTVar5 == (Timestamp *)0x0) {
        local_9e8 = 0;
      }
      else {
        local_9e8 = __dynamic_cast(pTVar5,&mir::inst::Inst::typeinfo,
                                   &mir::inst::PtrOffsetInst::typeinfo,0);
      }
      local_558 = local_9e8;
      in_stack_fffffffffffff5d0 = local_588;
      mir::inst::VarId::VarId
                ((VarId *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (VarId *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_varId(in_stack_fffffffffffff558,(VarId *)in_stack_fffffffffffff550);
      mir::inst::VarId::VarId
                ((VarId *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (VarId *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_varId(in_stack_fffffffffffff558,(VarId *)in_stack_fffffffffffff550);
      mir::inst::Value::Value
                ((Value *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (Value *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_value(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
      std::make_unique<mir::inst::PtrOffsetInst,mir::inst::VarId,mir::inst::VarId,mir::inst::Value>
                (in_stack_fffffffffffff5a8,(VarId *)in_stack_fffffffffffff5a0,
                 in_stack_fffffffffffff598);
      std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
      unique_ptr<mir::inst::PtrOffsetInst,std::default_delete<mir::inst::PtrOffsetInst>,void>
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550,
                 (unique_ptr<mir::inst::PtrOffsetInst,_std::default_delete<mir::inst::PtrOffsetInst>_>
                  *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                  (value_type *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550);
      std::unique_ptr<mir::inst::PtrOffsetInst,_std::default_delete<mir::inst::PtrOffsetInst>_>::
      ~unique_ptr((unique_ptr<mir::inst::PtrOffsetInst,_std::default_delete<mir::inst::PtrOffsetInst>_>
                   *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
      break;
    case 6:
      if (pTVar5 == (Timestamp *)0x0) {
        in_stack_fffffffffffff640 = (ostream *)0x0;
      }
      else {
        in_stack_fffffffffffff640 =
             (ostream *)
             __dynamic_cast(pTVar5,&mir::inst::Inst::typeinfo,&mir::inst::CallInst::typeinfo,0);
      }
      local_490 = in_stack_fffffffffffff640;
      std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::vector
                ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)0x158817);
      local_4b0 = local_490 + 0x38;
      local_4b8._M_current =
           (Value *)std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::begin
                              ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                               CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      local_4c0 = (Value *)std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::end
                                     ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *
                                      )CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538)
                                     );
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                                (__normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538)),
            bVar1) {
        __gnu_cxx::
        __normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
        ::operator*(&local_4b8);
        mir::inst::Value::Value
                  ((Value *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                   (Value *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
        mir::inst::Value::Value
                  ((Value *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                   (Value *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
        cast_value(in_stack_fffffffffffff578,in_stack_fffffffffffff570);
        std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::push_back
                  ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                   CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                   (value_type *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
        __gnu_cxx::
        __normal_iterator<mir::inst::Value_*,_std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>_>
        ::operator++(&local_4b8);
      }
      in_stack_fffffffffffff638 = local_550;
      mir::inst::VarId::VarId
                ((VarId *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (VarId *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_varId(in_stack_fffffffffffff558,(VarId *)in_stack_fffffffffffff550);
      std::
      make_unique<mir::inst::CallInst,mir::inst::VarId,std::__cxx11::string&,std::vector<mir::inst::Value,std::allocator<mir::inst::Value>>&>
                ((VarId *)in_stack_fffffffffffff5b8,in_stack_fffffffffffff5b0,
                 (vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                 in_stack_fffffffffffff5a8);
      std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
      unique_ptr<mir::inst::CallInst,std::default_delete<mir::inst::CallInst>,void>
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550,
                 (unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_> *)
                 CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                  (value_type *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550);
      std::unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_>::~unique_ptr
                ((unique_ptr<mir::inst::CallInst,_std::default_delete<mir::inst::CallInst>_> *)
                 CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
      std::vector<mir::inst::Value,_std::allocator<mir::inst::Value>_>::~vector
                ((vector<mir::inst::Value,_std::allocator<mir::inst::Value>_> *)
                 in_stack_fffffffffffff550);
      break;
    case 7:
      if (pTVar5 == (Timestamp *)0x0) {
        in_stack_fffffffffffff5c0 = (Value *)0x0;
        in_stack_fffffffffffff5c8 = pTVar5;
      }
      else {
        in_stack_fffffffffffff5c0 =
             (Value *)__dynamic_cast(pTVar5,&mir::inst::Inst::typeinfo,&mir::inst::PhiInst::typeinfo
                                     ,0);
        in_stack_fffffffffffff5c8 = pTVar5;
      }
      local_5f0 = in_stack_fffffffffffff5c0;
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)0x158c87);
      local_610 = &local_5f0[1].field_0x8;
      local_630._24_8_ =
           std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::begin
                     ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                      CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      local_630._16_8_ =
           std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::end
                     ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                      CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                                (__normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538)),
            bVar1) {
        __gnu_cxx::
        __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
        ::operator*((__normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                     *)(local_630 + 0x18));
        in_stack_fffffffffffff5b0 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_630;
        mir::inst::VarId::VarId
                  ((VarId *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                   (VarId *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
        in_stack_fffffffffffff5b8 = (Value *)(local_658 + 8);
        mir::inst::VarId::VarId
                  ((VarId *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                   (VarId *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
        cast_varId(in_stack_fffffffffffff558,(VarId *)in_stack_fffffffffffff550);
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::push_back
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                   (value_type *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
        __gnu_cxx::
        __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
        ::operator++((__normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
                      *)(local_630 + 0x18));
      }
      in_stack_fffffffffffff5a0 = (BasicBlk *)&local_168->inst;
      in_stack_fffffffffffff5a8 = local_680;
      mir::inst::VarId::VarId
                ((VarId *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 (VarId *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      cast_varId(in_stack_fffffffffffff558,(VarId *)in_stack_fffffffffffff550);
      std::
      make_unique<mir::inst::PhiInst,mir::inst::VarId,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>&>
                ((VarId *)in_stack_fffffffffffff588,
                 (vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 in_stack_fffffffffffff580);
      in_stack_fffffffffffff598 = (Value *)local_658;
      std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>::
      unique_ptr<mir::inst::PhiInst,std::default_delete<mir::inst::PhiInst>,void>
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550,
                 (unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_> *)
                 CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
      std::
      vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
      ::push_back((vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                   *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                  (value_type *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::~unique_ptr
                ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                 in_stack_fffffffffffff550);
      std::unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_>::~unique_ptr
                ((unique_ptr<mir::inst::PhiInst,_std::default_delete<mir::inst::PhiInst>_> *)
                 CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
      std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::~vector
                ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                 in_stack_fffffffffffff550);
      break;
    default:
      local_681 = 0;
      in_stack_fffffffffffff580 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           AixLog::operator<<(in_stack_fffffffffffff640,in_stack_fffffffffffff638);
      in_stack_fffffffffffff588 = &local_6b8;
      AixLog::Tag::Tag((Tag *)0x158eb6);
      in_stack_fffffffffffff590 =
           (Value *)AixLog::operator<<((ostream *)in_stack_fffffffffffff570,
                                       (Tag *)in_stack_fffffffffffff568);
      local_6d8.__d.__r = (duration)std::chrono::_V2::system_clock::now();
      AixLog::Timestamp::Timestamp(&local_6d0,&local_6d8);
      in_stack_fffffffffffff578 =
           (Rewriter *)AixLog::operator<<(in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
      in_stack_fffffffffffff570 = (Value *)local_751;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff580,(char *)in_stack_fffffffffffff578,
                 (allocator<char> *)in_stack_fffffffffffff570);
      in_stack_fffffffffffff568 = (Function *)local_779;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff580,(char *)in_stack_fffffffffffff578,
                 (allocator<char> *)in_stack_fffffffffffff570);
      AixLog::Function::Function
                (in_stack_fffffffffffff550,
                 (string *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548),
                 (string *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
                 CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
      in_stack_fffffffffffff560 =
           (JumpInstruction *)
           AixLog::operator<<((ostream *)in_stack_fffffffffffff570,in_stack_fffffffffffff568);
      in_stack_fffffffffffff558 =
           (Rewriter *)std::operator<<((ostream *)in_stack_fffffffffffff560,"error!");
      std::ostream::operator<<(in_stack_fffffffffffff558,std::endl<char,std::char_traits<char>>);
      AixLog::Function::~Function
                ((Function *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
      std::__cxx11::string::~string((string *)(local_779 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_779);
      std::__cxx11::string::~string((string *)(local_751 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_751);
      AixLog::Timestamp::~Timestamp(&local_6d0);
      AixLog::Tag::~Tag((Tag *)0x159026);
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_*,_std::vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>_>
    ::operator++(&local_1a8);
  }
  std::optional<mir::inst::VarId>::optional((optional<mir::inst::VarId> *)0x15912f);
  local_79c = *(mapped_type *)(local_10 + 0x80);
  local_7a0 = *(mapped_type *)(local_10 + 0x84);
  sVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     in_stack_fffffffffffff550,
                     (key_type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  if (sVar6 != 0) {
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)in_stack_fffffffffffff560,(key_type *)in_stack_fffffffffffff558);
    local_79c = *pmVar2;
  }
  sVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                    ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                     in_stack_fffffffffffff550,
                     (key_type *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  if (sVar6 != 0) {
    pmVar2 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)in_stack_fffffffffffff560,(key_type *)in_stack_fffffffffffff558);
    local_7a0 = *pmVar2;
  }
  bVar1 = std::optional<mir::inst::VarId>::has_value((optional<mir::inst::VarId> *)0x1591f0);
  if (bVar1) {
    std::optional<mir::inst::VarId>::value
              ((optional<mir::inst::VarId> *)
               CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
    std::optional<mir::inst::VarId>::operator=
              ((optional<mir::inst::VarId> *)in_stack_fffffffffffff550,
               (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
    in_stack_fffffffffffff550 = (Function *)(in_RDI + 0x10);
    pVVar7 = std::optional<mir::inst::VarId>::value
                       ((optional<mir::inst::VarId> *)
                        CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540));
    local_7b4 = pVVar7->id;
    std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::at
              ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
               in_stack_fffffffffffff560,(key_type *)in_stack_fffffffffffff558);
    mir::inst::VarId::VarId
              ((VarId *)CONCAT44(in_stack_fffffffffffff544,in_stack_fffffffffffff540),
               in_stack_fffffffffffff53c);
    std::optional<mir::inst::VarId>::operator=
              ((optional<mir::inst::VarId> *)in_stack_fffffffffffff550,
               (VarId *)CONCAT44(in_stack_fffffffffffff54c,in_stack_fffffffffffff548));
  }
  bb_false_00 = (int)((ulong)in_stack_fffffffffffff550 >> 0x20);
  jump_kind = *(JumpKind *)(local_10 + 0x60);
  mVar11 = local_79c;
  mVar12 = local_7a0;
  std::optional<mir::inst::VarId>::optional
            ((optional<mir::inst::VarId> *)CONCAT44(jump_kind,in_stack_fffffffffffff540),
             (optional<mir::inst::VarId> *)
             CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  mir::inst::JumpInstruction::JumpInstruction
            (in_stack_fffffffffffff560,
             (JumpInstructionKind)((ulong)in_stack_fffffffffffff558 >> 0x20),
             (int)in_stack_fffffffffffff558,bb_false_00,
             (optional<mir::inst::VarId> *)CONCAT44(mVar12,mVar11),jump_kind);
  mir::inst::JumpInstruction::operator=
            ((JumpInstruction *)CONCAT44(jump_kind,in_stack_fffffffffffff540),
             (JumpInstruction *)CONCAT44(in_stack_fffffffffffff53c,in_stack_fffffffffffff538));
  mir::inst::JumpInstruction::~JumpInstruction(&local_7f0);
  return;
}

Assistant:

void cast_block(mir::inst::BasicBlk& blk) {
    auto new_id = label_cast_map.at(blk.id);
    func.basic_blks.insert(std::make_pair(new_id, mir::inst::BasicBlk(new_id)));
    auto& new_blk = func.basic_blks.at(new_id);
    for (auto pre : blk.preceding) {
      auto new_pre = label_cast_map.at(pre);
      if (new_pre == sub_starttId) {
        new_pre = cur_blkId;
      }
      new_blk.preceding.insert(new_pre);
    }

    for (auto& inst : blk.inst) {
      auto kind = inst->inst_kind();
      auto& i = *inst;
      switch (kind) {
        case mir::inst::InstKind::Ref: {
          auto refInst = dynamic_cast<mir::inst::RefInst*>(&i);
          auto val = refInst->val;
          std::variant<mir::inst::VarId, std::string> _val;
          if (val.index() == 0) {
            _val = mir::inst::VarId(
                var_cast_map.at(std::get<mir::inst::VarId>(val).id));
          } else {
            _val = std::get<std::string>(val);
          }
          new_blk.inst.push_back(std::make_unique<mir::inst::RefInst>(
              cast_varId(refInst->dest), _val));
          break;
        }
        case mir::inst::InstKind::Op: {
          auto opInst = dynamic_cast<mir::inst::OpInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::OpInst>(
              cast_varId(opInst->dest), cast_value(opInst->lhs),
              cast_value(opInst->rhs), opInst->op));
          break;
        }
        case mir::inst::InstKind::Assign: {
          auto assignInst = dynamic_cast<mir::inst::AssignInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::AssignInst>(
              cast_varId(assignInst->dest), cast_value(assignInst->src)));
          break;
        }
        case mir::inst::InstKind::Load: {
          auto loadInst = dynamic_cast<mir::inst::LoadInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::LoadInst>(
              cast_value(loadInst->src), cast_varId(loadInst->dest)));
          break;
        }
        case mir::inst::InstKind::Store: {
          auto storeInst = dynamic_cast<mir::inst::StoreInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::StoreInst>(
              cast_value(storeInst->val), cast_varId(storeInst->dest)));
          break;
        }
        case mir::inst::InstKind::Call: {
          auto callInst = dynamic_cast<mir::inst::CallInst*>(&i);
          std::vector<mir::inst::Value> paras;
          for (auto val : callInst->params) {
            paras.push_back(cast_value(val));
          }
          new_blk.inst.push_back(std::make_unique<mir::inst::CallInst>(
              cast_varId(callInst->dest), callInst->func, paras));
          break;
        }
        case mir::inst::InstKind::PtrOffset: {
          auto ptrInst = dynamic_cast<mir::inst::PtrOffsetInst*>(&i);
          new_blk.inst.push_back(std::make_unique<mir::inst::PtrOffsetInst>(
              cast_varId(ptrInst->dest), cast_varId(ptrInst->ptr),
              cast_value(ptrInst->offset)));
          break;
        }
        case mir::inst::InstKind::Phi: {
          auto phiInst = dynamic_cast<mir::inst::PhiInst*>(&i);
          std::vector<mir::inst::VarId> vars;
          for (auto vaR : phiInst->vars) {
            vars.push_back(cast_varId(vaR));
          }
          new_blk.inst.push_back(std::make_unique<mir::inst::PhiInst>(
              cast_varId(phiInst->dest), vars));
          break;
        }

        default:
          LOG(TRACE) << "error!" << std::endl;
      }
    }

    std::optional<mir::inst::VarId> cond_or_ret = {};
    auto bb_true = blk.jump.bb_true;
    auto bb_false = blk.jump.bb_false;
    if (label_cast_map.count(bb_true)) {
      bb_true = label_cast_map.at(bb_true);
      // if (bb_true == sub_endId) {
      //   bb_true = cur_blkId;
      // }
    }

    if (label_cast_map.count(bb_false)) {
      bb_false = label_cast_map.at(bb_false);
      // if (bb_false == sub_endId) {
      //   bb_false = cur_blkId;
      // }
    }

    if (blk.jump.cond_or_ret.has_value()) {
      cond_or_ret = blk.jump.cond_or_ret.value();
      cond_or_ret = mir::inst::VarId(var_cast_map.at(cond_or_ret.value().id));
    }
    new_blk.jump = mir::inst::JumpInstruction(blk.jump.kind, bb_true, bb_false,
                                              cond_or_ret, blk.jump.jump_kind);
  }